

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

void common_sampler_accept(common_sampler *gsmpl,llama_token token,bool accept_grammar)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,accept_grammar) != 0) {
    llama_sampler_accept(gsmpl->grmr,token);
  }
  llama_sampler_accept(gsmpl->chain,token);
  uVar1 = (gsmpl->prev).capacity;
  uVar2 = (gsmpl->prev).sz;
  if (uVar2 == uVar1) {
    (gsmpl->prev).first = ((gsmpl->prev).first + 1) % uVar1;
  }
  else {
    (gsmpl->prev).sz = uVar2 + 1;
  }
  sVar3 = (gsmpl->prev).pos;
  (gsmpl->prev).data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[sVar3] = token;
  (gsmpl->prev).pos = (sVar3 + 1) % uVar1;
  return;
}

Assistant:

void common_sampler_accept(struct common_sampler * gsmpl, llama_token token, bool accept_grammar) {
    if (accept_grammar) {
        llama_sampler_accept(gsmpl->grmr, token);
    }

    llama_sampler_accept(gsmpl->chain, token);

    gsmpl->prev.push_back(token);
}